

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscSymbolTable.h
# Opt level: O0

void __thiscall CNscSymbolTable::CopyFrom(CNscSymbolTable *this,CNscSymbolTable *pTable)

{
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  CNscSymbolTable *unaff_retaddr;
  
  in_RDI[1] = 0;
  MakeRoom(unaff_retaddr,(size_t)in_RDI);
  memcpy((void *)*in_RDI,(void *)*in_RSI,in_RSI[1]);
  memcpy(in_RDI + 5,in_RSI + 5,0x238);
  in_RDI[1] = in_RSI[1];
  in_RDI[4] = in_RSI[4];
  return;
}

Assistant:

void CopyFrom (CNscSymbolTable *pTable)
	{
		m_nSize = 0;
		MakeRoom (pTable ->m_nSize);
		memcpy (m_pauchData, pTable ->m_pauchData, pTable ->m_nSize);
		memcpy (&m_sFence, &pTable ->m_sFence, sizeof (m_sFence));
		m_nSize = pTable ->m_nSize;
		m_nGlobalIdentifierCount = pTable ->m_nGlobalIdentifierCount;
	}